

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void fts5SnippetFunction(Fts5ExtensionApi *pApi,Fts5Context *pFts,sqlite3_context *pCtx,int nVal,
                        sqlite3_value **apVal)

{
  long lVar1;
  uchar *puVar2;
  int iVar3;
  i64 iVar4;
  i64 iVar5;
  char *z;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  int iVar9;
  sqlite3_context *pCtx_00;
  int nToken;
  int ip;
  int nDocsize;
  int local_128;
  int local_124;
  int nColSize;
  uint local_11c;
  int local_118;
  int local_114;
  int io;
  int nInst;
  ulong local_108;
  uchar *local_100;
  int iAdj;
  int ic;
  int nDoc;
  char *local_e8;
  sqlite3_context *local_e0;
  i64 local_d8;
  size_t local_d0;
  Fts5SFinder sFinder;
  HighlightContext ctx;
  
  nInst = 0;
  nColSize = 0;
  if (nVal != 5) {
    sqlite3_result_error(pCtx,"wrong number of arguments to function snippet()",-1);
    return;
  }
  local_118 = (*pApi->xColumnCount)(pFts);
  ctx.iter.pApi = (Fts5ExtensionApi *)0x0;
  ctx.iter.pFts = (Fts5Context *)0x0;
  ctx.iter.iCol = 0;
  ctx.iter.iInst = 0;
  ctx.iter.nInst = 0;
  ctx.iter.iStart = 0;
  ctx.iter.iEnd = 0;
  ctx.iter._36_4_ = 0;
  ctx.iPos = 0;
  ctx.iRangeStart = 0;
  ctx.iRangeEnd = 0;
  ctx._52_4_ = 0;
  ctx.zOpen = (char *)0x0;
  ctx.zClose = (char *)0x0;
  ctx.zIn = (char *)0x0;
  ctx.nIn = 0;
  ctx.iOff = 0;
  ctx.zOut = (char *)0x0;
  iVar4 = sqlite3VdbeIntValue(*apVal);
  ctx.zOpen = fts5ValueToText(apVal[1]);
  ctx.zClose = fts5ValueToText(apVal[2]);
  local_e8 = fts5ValueToText(apVal[3]);
  iVar5 = sqlite3VdbeIntValue(apVal[4]);
  local_11c = 0;
  local_128 = 0;
  if (0 < (int)iVar4) {
    local_128 = (int)iVar4;
  }
  local_d8 = iVar4;
  iVar3 = (*pApi->xPhraseCount)(pFts);
  local_100 = (uchar *)sqlite3_malloc(iVar3);
  local_e0 = pCtx;
  if (local_100 == (uchar *)0x0) {
    ip = 7;
  }
  else {
    ip = (*pApi->xInstCount)(pFts,&nInst);
  }
  sFinder.aFirst = (int *)0x0;
  sFinder.zDoc = (char *)0x0;
  sFinder.iPos = 0;
  sFinder.nFirstAlloc = 0;
  sFinder.nFirst = 0;
  sFinder._12_4_ = 0;
  local_d0 = (size_t)iVar3;
  if (local_118 < 1) {
    local_118 = 0;
  }
  local_108 = 0;
  local_124 = 0;
  iVar4 = local_d8;
  iVar3 = local_118;
  for (iVar9 = 0; pCtx_00 = local_e0, nToken = (int)iVar5, iVar9 != iVar3; iVar9 = iVar9 + 1) {
    if ((int)iVar4 < 0 || iVar9 == (int)iVar4) {
      sFinder._0_8_ = sFinder._0_8_ & 0xffffffff00000000;
      sFinder._8_8_ = sFinder._8_8_ & 0xffffffff00000000;
      ip = (*pApi->xColumnText)(pFts,iVar9,&sFinder.zDoc,&nDoc);
      pCtx_00 = local_e0;
      if (((ip != 0) ||
          (ip = (*pApi->xTokenize)(pFts,sFinder.zDoc,nDoc,&sFinder,fts5SentenceFinderCb),
          pCtx_00 = local_e0, ip != 0)) ||
         (ip = (*pApi->xColumnSize)(pFts,iVar9,&nDocsize), pCtx_00 = local_e0, ip != 0))
      goto LAB_001c1532;
      ip = 0;
      for (iVar6 = 0; (iVar4 = local_d8, iVar3 = local_118, ip == 0 && (iVar6 < nInst));
          iVar6 = iVar6 + 1) {
        ip = (*pApi->xInst)(pFts,iVar6,&ip,&ic,&io);
        puVar2 = local_100;
        if (ic == iVar9) {
          if (nDocsize < io) {
            ip = 0x10b;
          }
          else if (ip == 0) {
            memset(local_100,0,local_d0);
            ip = fts5SnippetScore(pApi,pFts,nDocsize,puVar2,iVar9,io,nToken,&local_114,&iAdj);
            puVar2 = local_100;
            if ((ip == 0) && (local_124 < local_114)) {
              local_108 = (ulong)(uint)iAdj;
              nColSize = nDocsize;
              local_11c = nDocsize;
              local_124 = local_114;
              local_128 = iVar9;
            }
            if (((ip == 0) && (sFinder.nFirst != 0)) && (nToken < nDocsize)) {
              iVar3 = sFinder.nFirst;
              if (sFinder.nFirst < 2) {
                iVar3 = 1;
              }
              uVar7 = 0xffffffffffffffff;
              do {
                uVar8 = (ulong)(iVar3 - 1);
                if (uVar7 - (iVar3 - 1) == -1) break;
                uVar8 = uVar7 + 1;
                lVar1 = uVar7 + 2;
                uVar7 = uVar8;
              } while (sFinder.aFirst[lVar1] <= io);
              ip = 0;
              if (sFinder.aFirst[uVar8] < io) {
                memset(local_100,0,local_d0);
                ip = fts5SnippetScore(pApi,pFts,nDocsize,puVar2,iVar9,sFinder.aFirst[uVar8],nToken,
                                      &local_114,(int *)0x0);
                iVar3 = 100;
                if (sFinder.aFirst[uVar8] == 0) {
                  iVar3 = 0x78;
                }
                if ((ip == 0) && (local_124 < iVar3 + local_114)) {
                  nColSize = nDocsize;
                  ip = 0;
                  local_128 = iVar9;
                  local_124 = iVar3 + local_114;
                  local_11c = nColSize;
                  local_108 = (ulong)(uint)sFinder.aFirst[uVar8];
                }
              }
            }
          }
        }
      }
    }
  }
  if (ip == 0) {
    ip = (*pApi->xColumnText)(pFts,local_128,&ctx.zIn,&ctx.nIn);
    local_11c = local_11c | ip;
    if (local_11c == 0) {
      ip = (*pApi->xColumnSize)(pFts,local_128,&nColSize);
    }
  }
LAB_001c1532:
  if (ctx.zIn != (char *)0x0) {
    if (ip == 0) {
      ip = fts5CInstIterInit(pApi,pFts,local_128,&ctx.iter);
    }
    iVar3 = (int)local_108;
    ctx.iRangeStart = iVar3;
    ctx.iRangeEnd = nToken + -1 + iVar3;
    if (0 < iVar3) {
      fts5HighlightAppend(&ip,&ctx,local_e8,-1);
    }
    iVar9 = ip;
    while (((-1 < (long)ctx.iter._24_8_ && (ctx.iter.iStart < iVar3)) && (iVar9 == 0))) {
      iVar9 = fts5CInstIterNext(&ctx.iter);
    }
    ip = iVar9;
    if (iVar9 == 0) {
      ip = (*pApi->xTokenize)(pFts,ctx.zIn,ctx.nIn,&ctx,fts5HighlightCb);
    }
    if (ctx.iRangeEnd < nColSize + -1) {
      iVar3 = -1;
      z = local_e8;
    }
    else {
      iVar3 = ctx.nIn - ctx.iOff;
      z = ctx.zIn + ctx.iOff;
    }
    fts5HighlightAppend(&ip,&ctx,z,iVar3);
  }
  if (ip == 0) {
    sqlite3_result_text(pCtx_00,ctx.zOut,-1,(_func_void_void_ptr *)0xffffffffffffffff);
  }
  else {
    sqlite3_result_error_code(pCtx_00,ip);
  }
  sqlite3_free(ctx.zOut);
  sqlite3_free(local_100);
  sqlite3_free(sFinder.aFirst);
  return;
}

Assistant:

static void fts5SnippetFunction(
  const Fts5ExtensionApi *pApi,   /* API offered by current FTS version */
  Fts5Context *pFts,              /* First arg to pass to pApi functions */
  sqlite3_context *pCtx,          /* Context for returning result/error */
  int nVal,                       /* Number of values in apVal[] array */
  sqlite3_value **apVal           /* Array of trailing arguments */
){
  HighlightContext ctx;
  int rc = SQLITE_OK;             /* Return code */
  int iCol;                       /* 1st argument to snippet() */
  const char *zEllips;            /* 4th argument to snippet() */
  int nToken;                     /* 5th argument to snippet() */
  int nInst = 0;                  /* Number of instance matches this row */
  int i;                          /* Used to iterate through instances */
  int nPhrase;                    /* Number of phrases in query */
  unsigned char *aSeen;           /* Array of "seen instance" flags */
  int iBestCol;                   /* Column containing best snippet */
  int iBestStart = 0;             /* First token of best snippet */
  int nBestScore = 0;             /* Score of best snippet */
  int nColSize = 0;               /* Total size of iBestCol in tokens */
  Fts5SFinder sFinder;            /* Used to find the beginnings of sentences */
  int nCol;

  if( nVal!=5 ){
    const char *zErr = "wrong number of arguments to function snippet()";
    sqlite3_result_error(pCtx, zErr, -1);
    return;
  }

  nCol = pApi->xColumnCount(pFts);
  memset(&ctx, 0, sizeof(HighlightContext));
  iCol = sqlite3_value_int(apVal[0]);
  ctx.zOpen = fts5ValueToText(apVal[1]);
  ctx.zClose = fts5ValueToText(apVal[2]);
  zEllips = fts5ValueToText(apVal[3]);
  nToken = sqlite3_value_int(apVal[4]);

  iBestCol = (iCol>=0 ? iCol : 0);
  nPhrase = pApi->xPhraseCount(pFts);
  aSeen = sqlite3_malloc(nPhrase);
  if( aSeen==0 ){
    rc = SQLITE_NOMEM;
  }
  if( rc==SQLITE_OK ){
    rc = pApi->xInstCount(pFts, &nInst);
  }

  memset(&sFinder, 0, sizeof(Fts5SFinder));
  for(i=0; i<nCol; i++){
    if( iCol<0 || iCol==i ){
      int nDoc;
      int nDocsize;
      int ii;
      sFinder.iPos = 0;
      sFinder.nFirst = 0;
      rc = pApi->xColumnText(pFts, i, &sFinder.zDoc, &nDoc);
      if( rc!=SQLITE_OK ) break;
      rc = pApi->xTokenize(pFts, 
          sFinder.zDoc, nDoc, (void*)&sFinder,fts5SentenceFinderCb
      );
      if( rc!=SQLITE_OK ) break;
      rc = pApi->xColumnSize(pFts, i, &nDocsize);
      if( rc!=SQLITE_OK ) break;

      for(ii=0; rc==SQLITE_OK && ii<nInst; ii++){
        int ip, ic, io;
        int iAdj;
        int nScore;
        int jj;

        rc = pApi->xInst(pFts, ii, &ip, &ic, &io);
        if( ic!=i ) continue;
        if( io>nDocsize ) rc = FTS5_CORRUPT;
        if( rc!=SQLITE_OK ) continue;
        memset(aSeen, 0, nPhrase);
        rc = fts5SnippetScore(pApi, pFts, nDocsize, aSeen, i,
            io, nToken, &nScore, &iAdj
        );
        if( rc==SQLITE_OK && nScore>nBestScore ){
          nBestScore = nScore;
          iBestCol = i;
          iBestStart = iAdj;
          nColSize = nDocsize;
        }

        if( rc==SQLITE_OK && sFinder.nFirst && nDocsize>nToken ){
          for(jj=0; jj<(sFinder.nFirst-1); jj++){
            if( sFinder.aFirst[jj+1]>io ) break;
          }

          if( sFinder.aFirst[jj]<io ){
            memset(aSeen, 0, nPhrase);
            rc = fts5SnippetScore(pApi, pFts, nDocsize, aSeen, i, 
              sFinder.aFirst[jj], nToken, &nScore, 0
            );

            nScore += (sFinder.aFirst[jj]==0 ? 120 : 100);
            if( rc==SQLITE_OK && nScore>nBestScore ){
              nBestScore = nScore;
              iBestCol = i;
              iBestStart = sFinder.aFirst[jj];
              nColSize = nDocsize;
            }
          }
        }
      }
    }
  }

  if( rc==SQLITE_OK ){
    rc = pApi->xColumnText(pFts, iBestCol, &ctx.zIn, &ctx.nIn);
  }
  if( rc==SQLITE_OK && nColSize==0 ){
    rc = pApi->xColumnSize(pFts, iBestCol, &nColSize);
  }
  if( ctx.zIn ){
    if( rc==SQLITE_OK ){
      rc = fts5CInstIterInit(pApi, pFts, iBestCol, &ctx.iter);
    }

    ctx.iRangeStart = iBestStart;
    ctx.iRangeEnd = iBestStart + nToken - 1;

    if( iBestStart>0 ){
      fts5HighlightAppend(&rc, &ctx, zEllips, -1);
    }

    /* Advance iterator ctx.iter so that it points to the first coalesced
    ** phrase instance at or following position iBestStart. */
    while( ctx.iter.iStart>=0 && ctx.iter.iStart<iBestStart && rc==SQLITE_OK ){
      rc = fts5CInstIterNext(&ctx.iter);
    }

    if( rc==SQLITE_OK ){
      rc = pApi->xTokenize(pFts, ctx.zIn, ctx.nIn, (void*)&ctx,fts5HighlightCb);
    }
    if( ctx.iRangeEnd>=(nColSize-1) ){
      fts5HighlightAppend(&rc, &ctx, &ctx.zIn[ctx.iOff], ctx.nIn - ctx.iOff);
    }else{
      fts5HighlightAppend(&rc, &ctx, zEllips, -1);
    }
  }
  if( rc==SQLITE_OK ){
    sqlite3_result_text(pCtx, (const char*)ctx.zOut, -1, SQLITE_TRANSIENT);
  }else{
    sqlite3_result_error_code(pCtx, rc);
  }
  sqlite3_free(ctx.zOut);
  sqlite3_free(aSeen);
  sqlite3_free(sFinder.aFirst);
}